

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O0

uint32_t helper_recpe_u32_aarch64(uint32_t a,void *fpstp)

{
  uint32_t uVar1;
  int estimate;
  int input;
  void *fpstp_local;
  uint32_t a_local;
  
  if ((a & 0x80000000) == 0) {
    fpstp_local._4_4_ = 0xffffffff;
  }
  else {
    uVar1 = extract32(a,0x17,9);
    uVar1 = recip_estimate(uVar1);
    fpstp_local._4_4_ = deposit32(0,0x17,9,uVar1);
  }
  return fpstp_local._4_4_;
}

Assistant:

uint32_t HELPER(recpe_u32)(uint32_t a, void *fpstp)
{
    /* float_status *s = fpstp; */
    int input, estimate;

    if ((a & 0x80000000) == 0) {
        return 0xffffffff;
    }

    input = extract32(a, 23, 9);
    estimate = recip_estimate(input);

    return deposit32(0, (32 - 9), 9, estimate);
}